

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnLocalDecl
          (BinaryReaderInterp *this,Index decl_index,Index count,Type type)

{
  pointer *ppLVar1;
  FuncDesc *pFVar2;
  iterator __position;
  Result RVar3;
  Enum EVar4;
  LocalDesc local_34;
  
  RVar3 = SharedValidator::OnLocalDecl
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     count,type);
  EVar4 = Error;
  if (RVar3.enum_ != Error) {
    local_34.end = this->local_count_ + count;
    this->local_count_ = local_34.end;
    pFVar2 = this->func_;
    __position._M_current =
         (pFVar2->locals).
         super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_34.type.enum_ = type.enum_;
    local_34.count = count;
    if (__position._M_current ==
        (pFVar2->locals).
        super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>::
      _M_realloc_insert<wabt::interp::LocalDesc>(&pFVar2->locals,__position,&local_34);
    }
    else {
      (__position._M_current)->end = local_34.end;
      (__position._M_current)->type = (ValueType)type.enum_;
      (__position._M_current)->count = count;
      ppLVar1 = &(pFVar2->locals).
                 super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppLVar1 = *ppLVar1 + 1;
    }
    EVar4 = Ok;
    if (this->local_decl_count_ - 1 == decl_index) {
      Istream::Emit(this->istream_,InterpAlloca,this->local_count_);
      EVar4 = Ok;
    }
  }
  return (Result)EVar4;
}

Assistant:

Result BinaryReaderInterp::OnLocalDecl(Index decl_index,
                                       Index count,
                                       Type type) {
  CHECK_RESULT(validator_.OnLocalDecl(loc, count, type));

  local_count_ += count;
  func_->locals.push_back(LocalDesc{type, count, local_count_});

  if (decl_index == local_decl_count_ - 1) {
    istream_.Emit(Opcode::InterpAlloca, local_count_);
  }
  return Result::Ok;
}